

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestVector.cpp
# Opt level: O2

bool __thiscall celero::TestVector::containsGroup(TestVector *this,string *x)

{
  _Tuple_impl<0UL,_celero::TestVector::Impl_*,_std::default_delete<celero::TestVector::Impl>_>
  __mutex;
  _Tuple_impl<0UL,_celero::TestVector::Impl_*,_std::default_delete<celero::TestVector::Impl>_> _Var1
  ;
  shared_ptr<celero::Benchmark> *psVar2;
  bool bVar3;
  long lVar4;
  long lVar5;
  __normal_iterator<const_std::shared_ptr<celero::Benchmark>_*,_std::vector<std::shared_ptr<celero::Benchmark>,_std::allocator<std::shared_ptr<celero::Benchmark>_>_>_>
  _Var6;
  __normal_iterator<const_std::shared_ptr<celero::Benchmark>_*,_std::vector<std::shared_ptr<celero::Benchmark>,_std::allocator<std::shared_ptr<celero::Benchmark>_>_>_>
  __it;
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  
  __mutex.super__Head_base<0UL,_celero::TestVector::Impl_*,_false>._M_head_impl =
       (this->pimpl)._pimpl._M_t.
       super___uniq_ptr_impl<celero::TestVector::Impl,_std::default_delete<celero::TestVector::Impl>_>
       ._M_t.
       super__Tuple_impl<0UL,_celero::TestVector::Impl_*,_std::default_delete<celero::TestVector::Impl>_>
       .super__Head_base<0UL,_celero::TestVector::Impl_*,_false>;
  std::mutex::lock((mutex *)__mutex.super__Head_base<0UL,_celero::TestVector::Impl_*,_false>.
                            _M_head_impl);
  _Var1.super__Head_base<0UL,_celero::TestVector::Impl_*,_false>._M_head_impl =
       (this->pimpl)._pimpl._M_t.
       super___uniq_ptr_impl<celero::TestVector::Impl,_std::default_delete<celero::TestVector::Impl>_>
       ._M_t.
       super__Tuple_impl<0UL,_celero::TestVector::Impl_*,_std::default_delete<celero::TestVector::Impl>_>
       .super__Head_base<0UL,_celero::TestVector::Impl_*,_false>;
  __it._M_current =
       *(shared_ptr<celero::Benchmark> **)
        ((long)_Var1.super__Head_base<0UL,_celero::TestVector::Impl_*,_false>._M_head_impl + 0x28);
  psVar2 = *(shared_ptr<celero::Benchmark> **)
            ((long)_Var1.super__Head_base<0UL,_celero::TestVector::Impl_*,_false>._M_head_impl +
            0x30);
  std::__cxx11::string::string(local_90,(string *)x);
  std::__cxx11::string::string(local_70,local_90);
  std::__cxx11::string::string(local_b0,local_70);
  std::__cxx11::string::string(local_50,local_b0);
  std::__cxx11::string::~string(local_b0);
  std::__cxx11::string::string(local_b0,local_50);
  lVar4 = (long)psVar2 - (long)__it._M_current;
  for (lVar5 = lVar4 >> 6; _Var6._M_current = __it._M_current, 0 < lVar5; lVar5 = lVar5 + -1) {
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<celero::TestVector::containsGroup(std::__cxx11::string_const&)const::$_0>::
            operator()((_Iter_pred<celero::TestVector::containsGroup(std::__cxx11::string_const&)const::__0>
                        *)local_b0,__it);
    if (bVar3) goto LAB_0013db5a;
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<celero::TestVector::containsGroup(std::__cxx11::string_const&)const::$_0>::
            operator()((_Iter_pred<celero::TestVector::containsGroup(std::__cxx11::string_const&)const::__0>
                        *)local_b0,__it._M_current + 1);
    _Var6._M_current = __it._M_current + 1;
    if (bVar3) goto LAB_0013db5a;
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<celero::TestVector::containsGroup(std::__cxx11::string_const&)const::$_0>::
            operator()((_Iter_pred<celero::TestVector::containsGroup(std::__cxx11::string_const&)const::__0>
                        *)local_b0,__it._M_current + 2);
    _Var6._M_current = __it._M_current + 2;
    if (bVar3) goto LAB_0013db5a;
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<celero::TestVector::containsGroup(std::__cxx11::string_const&)const::$_0>::
            operator()((_Iter_pred<celero::TestVector::containsGroup(std::__cxx11::string_const&)const::__0>
                        *)local_b0,__it._M_current + 3);
    _Var6._M_current = __it._M_current + 3;
    if (bVar3) goto LAB_0013db5a;
    __it._M_current = __it._M_current + 4;
    lVar4 = lVar4 + -0x40;
  }
  lVar4 = lVar4 >> 4;
  if (lVar4 != 1) {
    if (lVar4 != 2) {
      _Var6._M_current = psVar2;
      if ((lVar4 != 3) ||
         (bVar3 = __gnu_cxx::__ops::
                  _Iter_pred<celero::TestVector::containsGroup(std::__cxx11::string_const&)const::$_0>
                  ::operator()((_Iter_pred<celero::TestVector::containsGroup(std::__cxx11::string_const&)const::__0>
                                *)local_b0,__it), _Var6._M_current = __it._M_current, bVar3))
      goto LAB_0013db5a;
      _Var6._M_current = __it._M_current + 1;
    }
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<celero::TestVector::containsGroup(std::__cxx11::string_const&)const::$_0>::
            operator()((_Iter_pred<celero::TestVector::containsGroup(std::__cxx11::string_const&)const::__0>
                        *)local_b0,_Var6);
    if (bVar3) goto LAB_0013db5a;
    __it._M_current = _Var6._M_current + 1;
  }
  bVar3 = __gnu_cxx::__ops::
          _Iter_pred<celero::TestVector::containsGroup(std::__cxx11::string_const&)const::$_0>::
          operator()((_Iter_pred<celero::TestVector::containsGroup(std::__cxx11::string_const&)const::__0>
                      *)local_b0,__it);
  _Var6._M_current = psVar2;
  if (bVar3) {
    _Var6._M_current = __it._M_current;
  }
LAB_0013db5a:
  std::__cxx11::string::~string(local_b0);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_90);
  psVar2 = *(shared_ptr<celero::Benchmark> **)
            ((long)(this->pimpl)._pimpl._M_t.
                   super___uniq_ptr_impl<celero::TestVector::Impl,_std::default_delete<celero::TestVector::Impl>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_celero::TestVector::Impl_*,_std::default_delete<celero::TestVector::Impl>_>
                   .super__Head_base<0UL,_celero::TestVector::Impl_*,_false> + 0x30);
  pthread_mutex_unlock
            ((pthread_mutex_t *)
             __mutex.super__Head_base<0UL,_celero::TestVector::Impl_*,_false>._M_head_impl);
  return _Var6._M_current != psVar2;
}

Assistant:

bool TestVector::containsGroup(const std::string& x) const
{
	std::lock_guard<std::mutex> mutexLock(this->pimpl->testVectorMutex);

	const auto found = std::find_if(std::begin(this->pimpl->testVector), std::end(this->pimpl->testVector),
									[x](std::shared_ptr<Benchmark> const& bmark) -> bool { return (bmark->getName() == x); });

	return found != std::end(this->pimpl->testVector);
}